

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O0

TheoryTerm * __thiscall
Potassco::TheoryData::addTerm(TheoryData *this,Id_t termId,Tuple_t type,IdSpan *args)

{
  TheoryTerm *pTVar1;
  undefined8 in_RCX;
  int32_t base;
  Id_t in_ESI;
  TheoryData *in_RDI;
  FuncData *in_stack_ffffffffffffffc8;
  IdSpan *in_stack_ffffffffffffffd8;
  TheoryData *this_00;
  Tuple_t local_4;
  
  base = (int32_t)((ulong)in_RCX >> 0x20);
  this_00 = in_RDI;
  Tuple_t::operator_cast_to_int(&local_4);
  FuncData::newFunc(base,in_stack_ffffffffffffffd8);
  TheoryTerm::TheoryTerm((TheoryTerm *)in_RDI,in_stack_ffffffffffffffc8);
  pTVar1 = setTerm(this_00,in_ESI);
  pTVar1->data_ = (uint64_t)in_stack_ffffffffffffffd8;
  return pTVar1;
}

Assistant:

const TheoryTerm& TheoryData::addTerm(Id_t termId, Tuple_t type, const IdSpan& args) {
	return setTerm(termId) = TheoryTerm(FuncData::newFunc(static_cast<int32_t>(type), args));
}